

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O1

SetInfluences * __thiscall wasm::LocalGraph::getSetInfluences(LocalGraph *this,LocalSet *set)

{
  ulong uVar1;
  SetInfluences *in_RAX;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->setInfluences)._M_h._M_bucket_count;
  uVar3 = (ulong)set % uVar1;
  p_Var4 = (this->setInfluences)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (LocalSet *)p_Var4->_M_nxt[1]._M_nxt != set)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (LocalSet *)p_Var2[1]._M_nxt == set)) goto LAB_0097fa6a;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0097fa6a:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    if (getSetInfluences(wasm::LocalSet*)::empty == '\0') {
      getSetInfluences();
    }
    else {
      in_RAX = &getSetInfluences::empty;
    }
  }
  else {
    in_RAX = (SetInfluences *)(p_Var2 + 2);
  }
  return in_RAX;
}

Assistant:

const SetInfluences& getSetInfluences(LocalSet* set) const {
    auto iter = setInfluences.find(set);
    if (iter == setInfluences.end()) {
      // Use a canonical constant empty set to avoid allocation.
      static const SetInfluences empty;
      return empty;
    }
    return iter->second;
  }